

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::CPY_AB(CPU *this)

{
  byte bVar1;
  uint16_t address;
  byte bVar2;
  
  this->cycles = 4;
  address = GetWord(this);
  bVar1 = ReadByte(this,address);
  bVar2 = this->Y - bVar1;
  (this->field_6).ps =
       bVar2 & 0x80 | (bVar2 == 0) * '\x02' | bVar1 <= this->Y | (this->field_6).ps & 0x7c;
  return;
}

Assistant:

void CPU::CPY_AB()
{
    cycles = 4;
    uint8_t op = ReadByte(GetWord());
    uint8_t res = Y - op;
    C = (Y >= op);
    Z = (Y == op);
    N = (res & 0b10000000) > 0;
}